

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O1

uzoff_t __thiscall IZDeflate::deflate_fast(IZDeflate *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uzoff_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uch *puVar9;
  int iVar10;
  IPos cur_match;
  
  this->prev_length = 2;
  uVar2 = this->lookahead;
  if (uVar2 != 0) {
    uVar6 = 0;
    cur_match = 0;
    do {
      if (2 < uVar2) {
        uVar7 = this->strstart;
        uVar5 = (this->ins_h & 0x3ff) << 5 ^ (uint)this->window[uVar7 + 2];
        this->ins_h = uVar5;
        cur_match = (IPos)this->head[uVar5];
        this->prev[uVar7 & 0x7fff] = this->head[uVar5];
        this->head[uVar5] = (Pos)uVar7;
      }
      if ((cur_match != 0) && (this->strstart - cur_match < 0x7efb)) {
        if (uVar2 < (uint)this->nice_match) {
          this->nice_match = uVar2;
        }
        uVar2 = longest_match(this,cur_match);
        uVar6 = this->lookahead;
        if (uVar2 < this->lookahead) {
          uVar6 = uVar2;
        }
      }
      if (uVar6 < 3) {
        iVar3 = ct_tally(this,0,(uint)this->window[this->strstart]);
        this->lookahead = this->lookahead - 1;
        this->strstart = this->strstart + 1;
      }
      else {
        iVar3 = ct_tally(this,this->strstart - this->match_start,uVar6 - 3);
        uVar2 = this->lookahead - uVar6;
        this->lookahead = uVar2;
        if (uVar2 < 3 || this->max_lazy_match < uVar6) {
          uVar2 = this->strstart;
          uVar7 = uVar2 + uVar6;
          this->strstart = uVar7;
          bVar1 = this->window[uVar7];
          this->ins_h = (uint)bVar1;
          this->ins_h = (uint)this->window[uVar2 + uVar6 + 1] ^ (uint)bVar1 << 5;
        }
        else {
          iVar10 = uVar6 - 1;
          uVar8 = (ulong)this->ins_h;
          uVar2 = this->strstart + 1;
          do {
            this->strstart = uVar2;
            uVar6 = ((uint)uVar8 & 0x3ff) << 5 ^ (uint)this->window[uVar2 + 2];
            uVar8 = (ulong)uVar6;
            this->ins_h = uVar6;
            cur_match = (IPos)this->head[uVar8];
            this->prev[uVar2 & 0x7fff] = this->head[uVar8];
            this->head[uVar8] = (Pos)uVar2;
            uVar2 = uVar2 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          this->strstart = uVar2;
        }
        uVar6 = 0;
      }
      if (iVar3 != 0) {
        uVar8 = this->block_start;
        puVar9 = this->window + (uVar8 & 0xffffffff);
        if ((long)uVar8 < 0) {
          puVar9 = (uch *)0x0;
        }
        flush_block(this,(char *)puVar9,this->strstart - uVar8,0);
        this->block_start = (ulong)this->strstart;
      }
      if (this->lookahead < 0x106) {
        fill_window(this);
      }
      uVar2 = this->lookahead;
    } while (uVar2 != 0);
  }
  uVar8 = this->block_start;
  puVar9 = (uch *)0x0;
  if (-1 < (long)uVar8) {
    puVar9 = this->window + (uVar8 & 0xffffffff);
  }
  uVar4 = flush_block(this,(char *)puVar9,this->strstart - uVar8,1);
  return uVar4;
}

Assistant:

uzoff_t IZDeflate::deflate_fast()
{
    IPos hash_head = NIL;      /* head of the hash chain */
    int flush;                 /* set if current block must be flushed */
    unsigned match_length = 0; /* length of best match */

    prev_length = MIN_MATCH - 1;
    while (lookahead != 0) {
        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
#    ifndef DEFL_UNDETERM
        if (lookahead >= MIN_MATCH)
#    endif
            INSERT_STRING(strstart, hash_head);

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && strstart - hash_head <= MAX_DIST) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#    ifndef HUFFMAN_ONLY
#        ifndef DEFL_UNDETERM
            /* Do not look for matches beyond the end of the input.
             * This is necessary to make deflate deterministic.
             */
            if ((unsigned)nice_match > lookahead) nice_match = (int)lookahead;
#        endif
            match_length = longest_match(hash_head);
            /* longest_match() sets match_start */
            if (match_length > lookahead) match_length = lookahead;
#    endif
        }
        if (match_length >= MIN_MATCH) {
            check_match(strstart, match_start, match_length);

            flush = ct_tally(strstart - match_start, match_length - MIN_MATCH);

            lookahead -= match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_length <= max_insert_length
#    ifndef DEFL_UNDETERM
                && lookahead >= MIN_MATCH
#    endif
            ) {
                match_length--; /* string at strstart already in hash table */
                do {
                    strstart++;
                    INSERT_STRING(strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
#    ifdef DEFL_UNDETERM
                    /* If lookahead < MIN_MATCH these bytes are garbage,
                     * but it does not matter since the next lookahead bytes
                     * will be emitted as literals.
                     */
#    endif
                } while (--match_length != 0);
                strstart++;
            } else {
                strstart += match_length;
                match_length = 0;
                ins_h = window[strstart];
                UPDATE_HASH(ins_h, window[strstart + 1]);
#    if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH - 3 more times
#    endif
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr, "%c", window[strstart]));
            flush = ct_tally(0, window[strstart]);
            lookahead--;
            strstart++;
        }
        if (flush) FLUSH_BLOCK(0), block_start = strstart;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (lookahead < MIN_LOOKAHEAD) fill_window();
    }
    return FLUSH_BLOCK(1); /* eof */
}